

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::SpotLight::SpotLight
          (SpotLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Iemit,Float scale,Float totalWidth,Float falloffStart,Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long in_FS_OFFSET;
  float fVar16;
  Float vb;
  Float va;
  undefined4 uStack_14;
  
  (this->super_LightBase).type = DeltaPosition;
  uVar1 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar2 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar3 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar4 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar5 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar6 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar7 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar8 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar9 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar10 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar11 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar12 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar13 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar14 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar15 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar1;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar2;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar3;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar4;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar5;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar6;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar7;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar8;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar9;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar10;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar11;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar12;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar13;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar14;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar15;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
  _va = (Iemit->
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Iemit,(SpectrumHandle *)&va,0x168,0x33e,alloc);
  this->scale = scale;
  fVar16 = cosf(falloffStart * 0.017453292);
  this->cosFalloffStart = fVar16;
  fVar16 = cosf(totalWidth * 0.017453292);
  this->cosFalloffEnd = fVar16;
  va = falloffStart;
  if (falloffStart <= totalWidth) {
    return;
  }
  vb = totalWidth;
  LogFatal<char_const(&)[13],char_const(&)[11],char_const(&)[13],float&,char_const(&)[11],float&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
             ,0x4ef,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [13])"falloffStart",
             (char (*) [11])"totalWidth",(char (*) [13])"falloffStart",(float *)&va,
             (char (*) [11])"totalWidth",&vb);
}

Assistant:

SpotLight::SpotLight(const Transform &renderFromLight,
                     const MediumInterface &mediumInterface, SpectrumHandle Iemit,
                     Float scale, Float totalWidth, Float falloffStart, Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      Iemit(Iemit, alloc),
      scale(scale),
      cosFalloffEnd(std::cos(Radians(totalWidth))),
      cosFalloffStart(std::cos(Radians(falloffStart))) {
    CHECK_LE(falloffStart, totalWidth);
}